

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O0

Stream * rw::writeMaterialMatFX
                   (Stream *stream,int32 param_2,void *object,int32 offset,int32 param_5)

{
  int iVar1;
  long lVar2;
  undefined4 local_34;
  int i;
  MatFX *matfx;
  int32 param_4_local;
  int32 offset_local;
  void *object_local;
  int32 param_1_local;
  Stream *stream_local;
  
  lVar2 = *(long *)((long)object + (long)offset);
  Stream::writeU32(stream,*(uint32 *)(lVar2 + 0x50));
  for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
    Stream::writeU32(stream,*(uint32 *)(lVar2 + (long)local_34 * 0x28));
    iVar1 = *(int *)(lVar2 + (long)local_34 * 0x28);
    if (iVar1 == 1) {
      Stream::writeF32(stream,*(float32 *)(lVar2 + (long)local_34 * 0x28 + 0x20));
      Stream::writeI32(stream,(uint)(*(long *)(lVar2 + (long)local_34 * 0x28 + 0x10) != 0));
      if (*(long *)(lVar2 + (long)local_34 * 0x28 + 0x10) != 0) {
        Texture::streamWrite(*(Texture **)(lVar2 + (long)local_34 * 0x28 + 0x10),stream);
      }
      Stream::writeI32(stream,(uint)(*(long *)(lVar2 + (long)local_34 * 0x28 + 0x18) != 0));
      if (*(long *)(lVar2 + (long)local_34 * 0x28 + 0x18) != 0) {
        Texture::streamWrite(*(Texture **)(lVar2 + (long)local_34 * 0x28 + 0x18),stream);
      }
    }
    else if (iVar1 == 2) {
      Stream::writeF32(stream,*(float32 *)(lVar2 + (long)local_34 * 0x28 + 0x18));
      Stream::writeI32(stream,*(int32 *)(lVar2 + (long)local_34 * 0x28 + 0x1c));
      Stream::writeI32(stream,(uint)(*(long *)(lVar2 + (long)local_34 * 0x28 + 0x10) != 0));
      if (*(long *)(lVar2 + (long)local_34 * 0x28 + 0x10) != 0) {
        Texture::streamWrite(*(Texture **)(lVar2 + (long)local_34 * 0x28 + 0x10),stream);
      }
    }
    else if (iVar1 == 4) {
      Stream::writeI32(stream,*(int32 *)(lVar2 + (long)local_34 * 0x28 + 0x10));
      Stream::writeI32(stream,*(int32 *)(lVar2 + (long)local_34 * 0x28 + 0x14));
      Stream::writeI32(stream,(uint)(*(long *)(lVar2 + (long)local_34 * 0x28 + 8) != 0));
      if (*(long *)(lVar2 + (long)local_34 * 0x28 + 8) != 0) {
        Texture::streamWrite(*(Texture **)(lVar2 + (long)local_34 * 0x28 + 8),stream);
      }
    }
  }
  return stream;
}

Assistant:

static Stream*
writeMaterialMatFX(Stream *stream, int32, void *object, int32 offset, int32)
{
	MatFX *matfx = *PLUGINOFFSET(MatFX*, object, offset);

	stream->writeU32(matfx->type);
	for(int i = 0; i < 2; i++){
		stream->writeU32(matfx->fx[i].type);
		switch(matfx->fx[i].type){
		case MatFX::BUMPMAP:
			stream->writeF32(matfx->fx[i].bump.coefficient);
			stream->writeI32(matfx->fx[i].bump.bumpedTex != nil);
			if(matfx->fx[i].bump.bumpedTex)
				matfx->fx[i].bump.bumpedTex->streamWrite(stream);
			stream->writeI32(matfx->fx[i].bump.tex != nil);
			if(matfx->fx[i].bump.tex)
				matfx->fx[i].bump.tex->streamWrite(stream);
			break;

		case MatFX::ENVMAP:
			stream->writeF32(matfx->fx[i].env.coefficient);
			stream->writeI32(matfx->fx[i].env.fbAlpha);
			stream->writeI32(matfx->fx[i].env.tex != nil);
			if(matfx->fx[i].env.tex)
				matfx->fx[i].env.tex->streamWrite(stream);
			break;

		case MatFX::DUAL:
			stream->writeI32(matfx->fx[i].dual.srcBlend);
			stream->writeI32(matfx->fx[i].dual.dstBlend);
			stream->writeI32(matfx->fx[i].dual.tex != nil);
			if(matfx->fx[i].dual.tex)
				matfx->fx[i].dual.tex->streamWrite(stream);
			break;
		}
	}
	return stream;
}